

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_RollbackAfterAppending4mb_Test::TestBody
          (Transaction_RollbackAfterAppending4mb_Test *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer *__ptr;
  char *pcVar3;
  mock_mutex mutex;
  size_t original_num_regions;
  uint64_t original_size;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  unique_lock<mock_mutex> local_88;
  mutex_type local_71;
  unsigned_long local_70;
  unsigned_long local_68;
  transaction<std::unique_lock<mock_mutex>_> local_60;
  
  peVar1 = (this->super_Transaction).db_.super_database.storage_.file_.
           super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_68 = CONCAT44(extraout_var,iVar2);
  local_70 = (long)(this->super_Transaction).db_.super_database.storage_.regions_.
                   super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Transaction).db_.super_database.storage_.regions_.
                   super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_88._M_device = &local_71;
  local_88._M_owns = false;
  std::unique_lock<mock_mutex>::lock(&local_88);
  local_88._M_owns = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_60,&(this->super_Transaction).db_.super_database,&local_88);
  pstore::transaction_base::allocate(&local_60.super_transaction_base,0x400000,1);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)&local_88,"regions.size ()","original_num_regions",
             (unsigned_long *)&local_98,&local_70);
  if ((char)local_88._M_device == '\0') {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),"Allocate did not create regions",0x1f);
    if ((undefined8 *)CONCAT71(local_88._9_7_,local_88._M_owns) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_88._9_7_,local_88._M_owns);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_88._9_7_,local_88._M_owns) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88._M_owns,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_88._9_7_,local_88._M_owns));
  }
  iVar2 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(extraout_var_00,iVar2);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            ((internal *)&local_88,"file->size ()","original_size",(unsigned_long *)&local_98,
             &local_68);
  if ((char)local_88._M_device == '\0') {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),"The file did not grow!",0x16);
    if ((undefined8 *)CONCAT71(local_88._9_7_,local_88._M_owns) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_88._9_7_,local_88._M_owns);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_88._9_7_,local_88._M_owns) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88._M_owns,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_88._9_7_,local_88._M_owns));
  }
  pstore::transaction_base::rollback(&local_60.super_transaction_base);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_Transaction).db_.super_database.storage_.regions_.
              super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"regions.size ()","original_num_regions",
             (unsigned_long *)&local_98,&local_70);
  if ((char)local_88._M_device == '\0') {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),"Rollback did not reclaim regions",0x20);
    if ((undefined8 *)CONCAT71(local_88._9_7_,local_88._M_owns) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_88._9_7_,local_88._M_owns);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x165,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_88._9_7_,local_88._M_owns) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88._M_owns,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_88._9_7_,local_88._M_owns));
  }
  iVar2 = (*peVar1->_vptr_file_base[9])(peVar1);
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CONCAT44(extraout_var_01,iVar2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_88,"file->size ()","original_size",(unsigned_long *)&local_98,
             &local_68);
  if ((char)local_88._M_device == '\0') {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),
               "The file was not restored to its original size",0x2e);
    if ((undefined8 *)CONCAT71(local_88._9_7_,local_88._M_owns) == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(local_88._9_7_,local_88._M_owns);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x166,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_88._9_7_,local_88._M_owns) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88._M_owns,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_88._9_7_,local_88._M_owns));
  }
  local_60.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026b340;
  pstore::transaction_base::rollback(&local_60.super_transaction_base);
  return;
}

Assistant:

TEST_F (Transaction, RollbackAfterAppending4mb) {
    pstore::storage::region_container const & regions = db_.storage ().regions ();
    pstore::file::file_base * const file = db_.storage ().file ();

    mock_mutex mutex;
    std::uint64_t const original_size = file->size ();
    std::size_t const original_num_regions = regions.size ();
    constexpr auto bytes_to_allocate = 4U * 1024U * 1024U;

    auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});

    transaction.allocate (bytes_to_allocate, 1 /*align*/);
    EXPECT_GT (regions.size (), original_num_regions) << "Allocate did not create regions";
    EXPECT_GT (file->size (), original_size) << "The file did not grow!";

    // Abandon the transaction.
    transaction.rollback ();
    EXPECT_EQ (regions.size (), original_num_regions) << "Rollback did not reclaim regions";
    EXPECT_EQ (file->size (), original_size) << "The file was not restored to its original size";
}